

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::resolveDtd(QXmlStreamReaderPrivate *this)

{
  NotationDeclaration *pNVar1;
  EntityDeclaration *pEVar2;
  pointer pQVar3;
  long lVar4;
  pointer pQVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QXmlStreamNotationDeclaration>::resize
            (&this->publicNotationDeclarations,(this->notationDeclarations).tos + 1);
  lVar6 = 0;
  for (lVar4 = 0; lVar4 <= (this->notationDeclarations).tos; lVar4 = lVar4 + 1) {
    pNVar1 = (this->notationDeclarations).data;
    pQVar3 = QList<QXmlStreamNotationDeclaration>::data(&this->publicNotationDeclarations);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pNVar1->name).m_string + lVar6));
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar3->m_name).m_string.d + lVar6),&local_50
              );
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pNVar1->systemId).m_string + lVar6))
    ;
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar3->m_systemId).m_string.d + lVar6),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pNVar1->publicId).m_string + lVar6))
    ;
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar3->m_publicId).m_string.d + lVar6),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar6 = lVar6 + 0x48;
  }
  (this->notationDeclarations).tos = -1;
  QList<QXmlStreamEntityDeclaration>::resize
            (&this->publicEntityDeclarations,(this->entityDeclarations).tos + 1);
  lVar6 = 0;
  lVar7 = 0;
  for (lVar4 = 0; lVar4 <= (this->entityDeclarations).tos; lVar4 = lVar4 + 1) {
    pEVar2 = (this->entityDeclarations).data;
    pQVar5 = QList<QXmlStreamEntityDeclaration>::data(&this->publicEntityDeclarations);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pEVar2->name).m_string + lVar6));
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar5->m_name).m_string.d + lVar7),&local_50
              );
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,
               (XmlStringRef *)((long)&(pEVar2->notationName).m_string + lVar6));
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar5->m_notationName).m_string.d + lVar7),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pEVar2->systemId).m_string + lVar6))
    ;
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar5->m_systemId).m_string.d + lVar7),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pEVar2->publicId).m_string + lVar6))
    ;
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar5->m_publicId).m_string.d + lVar7),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)&(pEVar2->value).m_string + lVar6));
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar5->m_value).m_string.d + lVar7),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar7 = lVar7 + 0x78;
    lVar6 = lVar6 + 0x80;
  }
  (this->entityDeclarations).tos = -1;
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::clear(&this->parameterEntityHash);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolveDtd()
{
    publicNotationDeclarations.resize(notationDeclarations.size());
    for (qsizetype i = 0; i < notationDeclarations.size(); ++i) {
        const QXmlStreamReaderPrivate::NotationDeclaration &notationDeclaration = notationDeclarations.at(i);
        QXmlStreamNotationDeclaration &publicNotationDeclaration = publicNotationDeclarations[i];
        publicNotationDeclaration.m_name = notationDeclaration.name;
        publicNotationDeclaration.m_systemId = notationDeclaration.systemId;
        publicNotationDeclaration.m_publicId = notationDeclaration.publicId;

    }
    notationDeclarations.clear();
    publicEntityDeclarations.resize(entityDeclarations.size());
    for (qsizetype i = 0; i < entityDeclarations.size(); ++i) {
        const QXmlStreamReaderPrivate::EntityDeclaration &entityDeclaration = entityDeclarations.at(i);
        QXmlStreamEntityDeclaration &publicEntityDeclaration = publicEntityDeclarations[i];
        publicEntityDeclaration.m_name = entityDeclaration.name;
        publicEntityDeclaration.m_notationName = entityDeclaration.notationName;
        publicEntityDeclaration.m_systemId = entityDeclaration.systemId;
        publicEntityDeclaration.m_publicId = entityDeclaration.publicId;
        publicEntityDeclaration.m_value = entityDeclaration.value;
    }
    entityDeclarations.clear();
    parameterEntityHash.clear();
}